

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderMultisampleInterpolationTests.cpp
# Opt level: O0

string * __thiscall
deqp::gles31::Functional::(anonymous_namespace)::NegativeCompileInterpolationCase::
genShaderSource_abi_cxx11_(string *__return_storage_ptr__,void *this)

{
  int iVar1;
  GLSLVersion version;
  mapped_type *pmVar2;
  RenderContext *pRVar3;
  char *pcVar4;
  ostream *poVar5;
  ContextType local_30c;
  string local_308;
  ApiType local_2e8;
  allocator<char> local_2e1;
  string local_2e0;
  StringTemplate local_2c0;
  string local_2a0;
  allocator<char> local_279;
  key_type local_278;
  allocator<char> local_251;
  key_type local_250;
  undefined1 local_230 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  args;
  allocator<char> local_1e1;
  char *local_1e0;
  char *postSelector;
  char *interpolationTarget;
  char *localDeclarations;
  char *globalDeclarations;
  char *description;
  char *interpolationTemplate;
  string interpolation;
  ostringstream buf;
  NegativeCompileInterpolationCase *this_local;
  
  std::__cxx11::ostringstream::ostringstream
            ((ostringstream *)(interpolation.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&interpolationTemplate);
  localDeclarations = "";
  interpolationTarget = "";
  postSelector = "";
  local_1e0 = "";
  switch(*(undefined4 *)((long)this + 0x78)) {
  case 0:
    localDeclarations = "in highp vec4 v_var;\n";
    postSelector = "v_var.xyzw";
    globalDeclarations = "component selection is illegal";
    break;
  case 1:
    localDeclarations = "in highp vec4 v_var;\n";
    postSelector = "v_var.xy";
    local_1e0 = ".x";
    globalDeclarations = "component selection is illegal";
    break;
  case 2:
    localDeclarations = "in highp vec4 v_var;\n";
    postSelector = "v_var.yzxw";
    globalDeclarations = "component selection is illegal";
    break;
  case 3:
    localDeclarations = "flat in highp ivec4 v_var;\n";
    postSelector = "v_var";
    globalDeclarations = "no overload for ivec";
    break;
  case 4:
    localDeclarations = "flat in highp uvec4 v_var;\n";
    postSelector = "v_var";
    globalDeclarations = "no overload for uvec";
    break;
  case 5:
    localDeclarations = "in highp float v_var[2];\n";
    postSelector = "v_var";
    local_1e0 = "[1]";
    globalDeclarations = "no overload for arrays";
    break;
  case 6:
  case 7:
    localDeclarations = "struct S\n{\n\thighp float a;\n\thighp float b;\n};\nin S v_var;\n";
    postSelector = "v_var.a";
    if (*(int *)((long)this + 0x78) == 6) {
      postSelector = "v_var";
    }
    local_1e0 = "";
    if (*(int *)((long)this + 0x78) == 6) {
      local_1e0 = ".a";
    }
    globalDeclarations = "<interpolant> is not an input variable (just a member of)";
    if (*(int *)((long)this + 0x78) == 6) {
      globalDeclarations = "no overload for this type";
    }
    break;
  case 8:
    interpolationTarget = "\thighp vec4 local_var = gl_FragCoord;\n";
    postSelector = "local_var";
    globalDeclarations = "<interpolant> is not an input variable";
    break;
  case 9:
    localDeclarations = "highp vec4 global_var;\n";
    interpolationTarget = "\tglobal_var = gl_FragCoord;\n";
    postSelector = "global_var";
    globalDeclarations = "<interpolant> is not an input variable";
    break;
  case 10:
    localDeclarations = "const highp vec4 const_var = vec4(0.2);\n";
    postSelector = "const_var";
    globalDeclarations = "<interpolant> is not an input variable";
    break;
  default:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_1e1);
    std::allocator<char>::~allocator(&local_1e1);
    goto LAB_020be4cd;
  }
  iVar1 = *(int *)((long)this + 0x7c);
  if (iVar1 == 0) {
    description = "interpolateAtSample(${TARGET}, 0)${POST_SELECTOR}";
  }
  else if (iVar1 == 1) {
    description = "interpolateAtCentroid(${TARGET})${POST_SELECTOR}";
  }
  else {
    if (iVar1 != 2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"",
                 (allocator<char> *)
                 ((long)&args._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&args._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
      goto LAB_020be4cd;
    }
    description = "interpolateAtOffset(${TARGET}, vec2(0.2, 0.2))${POST_SELECTOR}";
  }
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)local_230);
  pcVar4 = postSelector;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_250,"TARGET",&local_251);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)local_230,&local_250);
  std::__cxx11::string::operator=((string *)pmVar2,pcVar4);
  std::__cxx11::string::~string((string *)&local_250);
  std::allocator<char>::~allocator(&local_251);
  pcVar4 = local_1e0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_278,"POST_SELECTOR",&local_279);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)local_230,&local_278);
  std::__cxx11::string::operator=((string *)pmVar2,pcVar4);
  std::__cxx11::string::~string((string *)&local_278);
  std::allocator<char>::~allocator(&local_279);
  pcVar4 = description;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2e0,pcVar4,&local_2e1);
  tcu::StringTemplate::StringTemplate(&local_2c0,&local_2e0);
  tcu::StringTemplate::specialize
            (&local_2a0,&local_2c0,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_230);
  std::__cxx11::string::operator=((string *)&interpolationTemplate,(string *)&local_2a0);
  std::__cxx11::string::~string((string *)&local_2a0);
  tcu::StringTemplate::~StringTemplate(&local_2c0);
  std::__cxx11::string::~string((string *)&local_2e0);
  std::allocator<char>::~allocator(&local_2e1);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)local_230);
  pRVar3 = gles31::Context::getRenderContext(*(Context **)((long)this + 0x70));
  local_2e8.m_bits = (*pRVar3->_vptr_RenderContext[2])();
  version = glu::getContextTypeGLSLVersion((ContextType)local_2e8.m_bits);
  pcVar4 = glu::getGLSLVersionDeclaration(version);
  poVar5 = std::operator<<((ostream *)((long)&interpolation.field_2 + 8),pcVar4);
  poVar5 = std::operator<<(poVar5,"\n");
  poVar5 = std::operator<<(poVar5,"${GLSL_EXT_SHADER_MULTISAMPLE_INTERPOLATION}");
  poVar5 = std::operator<<(poVar5,localDeclarations);
  poVar5 = std::operator<<(poVar5,
                           "layout(location = 0) out mediump vec4 fragColor;\nvoid main (void)\n{\n"
                          );
  poVar5 = std::operator<<(poVar5,interpolationTarget);
  poVar5 = std::operator<<(poVar5,"\tfragColor = vec4(");
  poVar5 = std::operator<<(poVar5,(string *)&interpolationTemplate);
  poVar5 = std::operator<<(poVar5,"); // ");
  poVar5 = std::operator<<(poVar5,globalDeclarations);
  std::operator<<(poVar5,"\n}\n");
  std::__cxx11::ostringstream::str();
  pRVar3 = gles31::Context::getRenderContext(*(Context **)((long)this + 0x70));
  local_30c.super_ApiType.m_bits = (ApiType)(*pRVar3->_vptr_RenderContext[2])();
  anon_unknown_2::specializeShader(__return_storage_ptr__,&local_308,&local_30c);
  std::__cxx11::string::~string((string *)&local_308);
LAB_020be4cd:
  std::__cxx11::string::~string((string *)&interpolationTemplate);
  std::__cxx11::ostringstream::~ostringstream
            ((ostringstream *)(interpolation.field_2._M_local_buf + 8));
  return __return_storage_ptr__;
}

Assistant:

std::string NegativeCompileInterpolationCase::genShaderSource (void) const
{
	std::ostringstream	buf;
	std::string			interpolation;
	const char*			interpolationTemplate;
	const char*			description;
	const char*			globalDeclarations		= "";
	const char*			localDeclarations		= "";
	const char*			interpolationTarget		= "";
	const char*			postSelector			= "";

	switch (m_caseType)
	{
		case CASE_VEC4_IDENTITY_SWIZZLE:
			globalDeclarations	= "in highp vec4 v_var;\n";
			interpolationTarget	= "v_var.xyzw";
			description			= "component selection is illegal";
			break;

		case CASE_VEC4_CROP_SWIZZLE:
			globalDeclarations	= "in highp vec4 v_var;\n";
			interpolationTarget	= "v_var.xy";
			postSelector		= ".x";
			description			= "component selection is illegal";
			break;

		case CASE_VEC4_MIXED_SWIZZLE:
			globalDeclarations	= "in highp vec4 v_var;\n";
			interpolationTarget	= "v_var.yzxw";
			description			= "component selection is illegal";
			break;

		case CASE_INTERPOLATE_IVEC4:
			globalDeclarations	= "flat in highp ivec4 v_var;\n";
			interpolationTarget	= "v_var";
			description			= "no overload for ivec";
			break;

		case CASE_INTERPOLATE_UVEC4:
			globalDeclarations	= "flat in highp uvec4 v_var;\n";
			interpolationTarget	= "v_var";
			description			= "no overload for uvec";
			break;

		case CASE_INTERPOLATE_ARRAY:
			globalDeclarations	= "in highp float v_var[2];\n";
			interpolationTarget	= "v_var";
			postSelector		= "[1]";
			description			= "no overload for arrays";
			break;

		case CASE_INTERPOLATE_STRUCT:
		case CASE_INTERPOLATE_STRUCT_MEMBER:
			globalDeclarations	=	"struct S\n"
									"{\n"
									"	highp float a;\n"
									"	highp float b;\n"
									"};\n"
									"in S v_var;\n";

			interpolationTarget	= (m_caseType == CASE_INTERPOLATE_STRUCT) ? ("v_var")						: ("v_var.a");
			postSelector		= (m_caseType == CASE_INTERPOLATE_STRUCT) ? (".a")							: ("");
			description			= (m_caseType == CASE_INTERPOLATE_STRUCT) ? ("no overload for this type")	: ("<interpolant> is not an input variable (just a member of)");
			break;

		case CASE_INTERPOLATE_LOCAL:
			localDeclarations	= "	highp vec4 local_var = gl_FragCoord;\n";
			interpolationTarget	= "local_var";
			description			= "<interpolant> is not an input variable";
			break;

		case CASE_INTERPOLATE_GLOBAL:
			globalDeclarations	= "highp vec4 global_var;\n";
			localDeclarations	= "	global_var = gl_FragCoord;\n";
			interpolationTarget	= "global_var";
			description			= "<interpolant> is not an input variable";
			break;

		case CASE_INTERPOLATE_CONSTANT:
			globalDeclarations	= "const highp vec4 const_var = vec4(0.2);\n";
			interpolationTarget	= "const_var";
			description			= "<interpolant> is not an input variable";
			break;

		default:
			DE_ASSERT(false);
			return "";
	}

	switch (m_interpolation)
	{
		case INTERPOLATE_AT_SAMPLE:
			interpolationTemplate = "interpolateAtSample(${TARGET}, 0)${POST_SELECTOR}";
			break;

		case INTERPOLATE_AT_CENTROID:
			interpolationTemplate = "interpolateAtCentroid(${TARGET})${POST_SELECTOR}";
			break;

		case INTERPOLATE_AT_OFFSET:
			interpolationTemplate = "interpolateAtOffset(${TARGET}, vec2(0.2, 0.2))${POST_SELECTOR}";
			break;

		default:
			DE_ASSERT(false);
			return "";
	}

	{
		std::map<std::string, std::string> args;
		args["TARGET"] = interpolationTarget;
		args["POST_SELECTOR"] = postSelector;

		interpolation = tcu::StringTemplate(interpolationTemplate).specialize(args);
	}

	buf <<	glu::getGLSLVersionDeclaration(glu::getContextTypeGLSLVersion(m_context.getRenderContext().getType())) << "\n"
		<< "${GLSL_EXT_SHADER_MULTISAMPLE_INTERPOLATION}"
		<<	globalDeclarations
		<<	"layout(location = 0) out mediump vec4 fragColor;\n"
			"void main (void)\n"
			"{\n"
		<<	localDeclarations
		<<	"	fragColor = vec4(" << interpolation << "); // " << description << "\n"
			"}\n";

	return specializeShader(buf.str(), m_context.getRenderContext().getType());
}